

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int do_and(void)

{
  byte bVar1;
  byte bVar2;
  vm_register *pvVar3;
  undefined4 *puVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  
  pvVar3 = registe_ptr;
  uVar7 = registe_ptr->IP;
  bVar5 = code_ptr[uVar7 + 2];
  bVar1 = bVar5 >> 4;
  bVar8 = bVar5 & 0xf;
  if (code_ptr[uVar7 + 1] == '\x01') {
    if (bVar8 == 2) {
      uVar7 = *register_list[bVar1] & *(uint *)(code_ptr + (ulong)uVar7 + 3);
      *register_list[bVar1] = uVar7;
joined_r0x00103b86:
      bVar9 = uVar7 == 0;
      bVar10 = (int)uVar7 < 0;
      if (bVar9) goto LAB_00103b41;
    }
    else {
      if (bVar8 == 1) {
        uVar6 = (ushort)*register_list[bVar1] & *(ushort *)(code_ptr + (ulong)uVar7 + 3);
        *(ushort *)register_list[bVar1] = uVar6;
        goto joined_r0x00103b3f;
      }
      if ((bVar5 & 0xf) != 0) goto LAB_00103bae;
      bVar5 = (byte)*register_list[bVar1] & code_ptr[(ulong)uVar7 + 3];
      *(byte *)register_list[bVar1] = bVar5;
LAB_00103b0e:
      bVar10 = (char)bVar5 < '\0';
      bVar9 = bVar5 == 0;
      pvVar3 = registe_ptr;
      if (bVar9) goto LAB_00103b41;
    }
LAB_00103b13:
    pvVar3->flag[0] = '\x01';
    if (bVar9 || bVar10) {
      pvVar3->flag[1] = '\0';
    }
    else {
      pvVar3->flag[1] = '\x01';
    }
  }
  else {
    if (code_ptr[uVar7 + 1] != '\0') {
LAB_00103bae:
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    bVar2 = (byte)code_ptr[uVar7 + 3] >> 4;
    if (bVar8 == 2) {
      uVar7 = *register_list[bVar1] & *register_list[bVar2];
      *register_list[bVar1] = uVar7;
      goto joined_r0x00103b86;
    }
    if (bVar8 != 1) {
      if ((bVar5 & 0xf) != 0) goto LAB_00103bae;
      bVar5 = (byte)*register_list[bVar1] & (byte)*register_list[bVar2];
      *(byte *)register_list[bVar1] = bVar5;
      goto LAB_00103b0e;
    }
    uVar6 = (ushort)*register_list[bVar1] & (ushort)*register_list[bVar2];
    *(ushort *)register_list[bVar1] = uVar6;
joined_r0x00103b3f:
    bVar9 = uVar6 == 0;
    bVar10 = (short)uVar6 < 0;
    if (!bVar9) goto LAB_00103b13;
LAB_00103b41:
    pvVar3->flag[0] = '\0';
  }
  return 1;
}

Assistant:

int do_and() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra &= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra &= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra &= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R &= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R &= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R &= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}